

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::PropagateSimpleDatePartStatistics<0l,1l>(vector<duckdb::BaseStatistics,_true> *child_stats)

{
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  BaseStatistics result;
  size_type in_stack_fffffffffffffec8;
  vector<duckdb::BaseStatistics,_true> *in_stack_fffffffffffffed0;
  Value local_110 [64];
  Value local_d0 [80];
  LogicalType local_80 [24];
  BaseStatistics local_68 [104];
  
  duckdb::LogicalType::LogicalType(local_80,BIGINT);
  duckdb::NumericStats::CreateEmpty(local_68,local_80);
  duckdb::LogicalType::~LogicalType(local_80);
  vector<duckdb::BaseStatistics,_true>::operator[]
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  duckdb::BaseStatistics::CopyValidity(local_68);
  duckdb::Value::BIGINT((long)local_d0);
  duckdb::NumericStats::SetMin(local_68,local_d0);
  duckdb::Value::~Value(local_d0);
  duckdb::Value::BIGINT((long)local_110);
  duckdb::NumericStats::SetMax(local_68,local_110);
  duckdb::Value::~Value(local_110);
  duckdb::BaseStatistics::ToUnique();
  duckdb::BaseStatistics::~BaseStatistics(local_68);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateSimpleDatePartStatistics(vector<BaseStatistics> &child_stats) {
	// we can always propagate simple date part statistics
	// since the min and max can never exceed these bounds
	auto result = NumericStats::CreateEmpty(LogicalType::BIGINT);
	result.CopyValidity(child_stats[0]);
	NumericStats::SetMin(result, Value::BIGINT(MIN));
	NumericStats::SetMax(result, Value::BIGINT(MAX));
	return result.ToUnique();
}